

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

int __thiscall QtMWidgets::Picker::findData(Picker *this,QVariant *data,int role,MatchFlags flags)

{
  int iVar1;
  QAbstractItemModel *pQVar2;
  bool bVar3;
  PickerPrivate *pPVar4;
  QModelIndex *this_00;
  QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
  *this_01;
  QList<QModelIndex> local_98;
  QPersistentModelIndex local_70 [24];
  undefined1 local_58 [8];
  QModelIndex start;
  QModelIndexList result;
  int role_local;
  QVariant *data_local;
  Picker *this_local;
  MatchFlags flags_local;
  
  QList<QModelIndex>::QList((QList<QModelIndex> *)&start.m);
  this_01 = &this->d;
  pPVar4 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
           ::operator->(this_01);
  pQVar2 = pPVar4->model;
  pPVar4 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
           ::operator->(this_01);
  iVar1 = pPVar4->modelColumn;
  QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>::
  operator->(this_01);
  QPersistentModelIndex::operator_cast_to_QModelIndex(local_70);
  (**(code **)(*(long *)pQVar2 + 0x60))(local_58,pQVar2,0,iVar1,local_70);
  pPVar4 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
           ::operator->(&this->d);
  (**(code **)(*(long *)pPVar4->model + 0x150))
            (&local_98,pPVar4->model,local_58,role,data,1,flags.i);
  QList<QModelIndex>::operator=((QList<QModelIndex> *)&start.m,&local_98);
  QList<QModelIndex>::~QList(&local_98);
  bVar3 = QList<QModelIndex>::isEmpty((QList<QModelIndex> *)&start.m);
  if (bVar3) {
    this_local._4_4_ = -1;
  }
  else {
    this_00 = QList<QModelIndex>::first((QList<QModelIndex> *)&start.m);
    this_local._4_4_ = QModelIndex::row(this_00);
  }
  QList<QModelIndex>::~QList((QList<QModelIndex> *)&start.m);
  return this_local._4_4_;
}

Assistant:

int
Picker::findData( const QVariant & data, int role, Qt::MatchFlags flags ) const
{
	QModelIndexList result;

	QModelIndex start = d->model->index( 0, d->modelColumn, d->root );

	result = d->model->match( start, role, data, 1, flags );

	if( result.isEmpty() )
		return -1;

	return result.first().row();
}